

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

bool maxValueScaleMatrix(HighsOptions *options,HighsLp *lp,HighsInt use_scale_strategy)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  ulong uVar13;
  long lVar14;
  HighsLogOptions *log_options_;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined8 uVar26;
  double dVar27;
  undefined8 uVar28;
  double dVar29;
  allocator_type local_d9;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  undefined1 local_b8 [16];
  double local_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  double local_50;
  vector<double,_std::allocator<double>_> row_max_value;
  value_type_conflict1 local_30;
  
  local_b8._8_8_ = local_b8._0_8_;
  uVar2 = lp->num_col_;
  uVar3 = lp->num_row_;
  local_c8 = ldexp(1.0,(options->super_HighsOptionsStruct).allowed_matrix_scale_factor);
  local_30 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&row_max_value,(long)(int)uVar3,&local_30,&local_d9);
  uVar13 = 0;
  uVar16 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar16 = uVar13;
  }
  piVar6 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar22 = INFINITY;
  dVar20 = 0.0;
  while (uVar13 != uVar16) {
    piVar1 = piVar6 + uVar13;
    iVar4 = piVar6[uVar13 + 1];
    uVar13 = uVar13 + 1;
    piVar7 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar14 = (long)*piVar1; lVar14 < iVar4; lVar14 = lVar14 + 1) {
      iVar5 = piVar7[lVar14];
      dVar17 = ABS(pdVar8[lVar14]);
      dVar19 = dVar17;
      if (dVar17 <= row_max_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar5]) {
        dVar19 = row_max_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar5];
      }
      row_max_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar5] = dVar19;
      dVar19 = dVar17;
      if (dVar22 <= dVar17) {
        dVar19 = dVar22;
      }
      if (dVar17 <= dVar20) {
        dVar17 = dVar20;
      }
      dVar20 = dVar17;
      dVar22 = dVar19;
    }
  }
  local_a0 = 1.0 / local_c8;
  uVar15 = 0;
  uVar13 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar13 = uVar15;
  }
  local_d8 = INFINITY;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_b8._8_8_;
  local_b8 = auVar24 << 0x40;
  uStack_60 = 0;
  uStack_70 = 0;
  local_78 = dVar22;
  local_68 = dVar20;
  for (; uVar13 != uVar15; uVar15 = uVar15 + 1) {
    dVar17 = row_max_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar15];
    if ((dVar17 != 0.0) || (NAN(dVar17))) {
      dVar20 = log(1.0 / dVar17);
      dVar20 = floor(dVar20 / 0.6931471805599453 + 0.5);
      dVar20 = exp2(dVar20);
      if (dVar20 <= local_a0) {
        dVar20 = local_a0;
      }
      dVar22 = local_c8;
      if (dVar20 <= local_c8) {
        dVar22 = dVar20;
      }
      if (dVar22 <= local_d8) {
        local_d8 = dVar22;
      }
      dVar20 = (double)local_b8._0_8_;
      if ((double)local_b8._0_8_ <= dVar22) {
        dVar20 = dVar22;
      }
      local_b8._0_8_ = dVar20;
      (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar15] = dVar22;
      dVar20 = local_68;
      dVar22 = local_78;
    }
  }
  dVar19 = INFINITY;
  uVar13 = 0;
  dVar27 = INFINITY;
  uVar28 = 0;
  dVar25 = 0.0;
  uVar26 = 0;
  dVar17 = 0.0;
  do {
    dVar21 = local_d8;
    piVar6 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      uVar15 = uVar13;
      if (uVar15 == uVar16) {
        auVar23._8_8_ = dVar25;
        auVar23._0_8_ = dVar20;
        auVar11._8_8_ = dVar27;
        auVar11._0_8_ = dVar22;
        auVar24 = divpd(auVar23,auVar11);
        dVar22 = auVar24._8_8_;
        dVar20 = auVar24._0_8_ / dVar22;
        if (dVar20 <= 1.0) {
          piVar6 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar13 = 0;
          while (uVar15 = uVar13, uVar15 != uVar16) {
            iVar4 = piVar6[uVar15 + 1];
            piVar7 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar8 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar9 = (lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar10 = (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            for (lVar14 = (long)piVar6[uVar15]; uVar13 = uVar15 + 1, lVar14 < iVar4;
                lVar14 = lVar14 + 1) {
              pdVar8[lVar14] = pdVar8[lVar14] / (pdVar9[uVar15] * pdVar10[piVar7[lVar14]]);
            }
          }
          if ((options->super_HighsOptionsStruct).log_dev_level != 0) {
            local_d8 = dVar20;
            dStack_d0 = dVar22;
            highsLogDev(&(options->super_HighsOptionsStruct).log_options,kInfo,
                        "Scaling: Improvement factor %0.4g < %0.4g required, so no scaling applied\n"
                        ,dVar20,0x3ff0000000000000);
            dVar20 = local_d8;
          }
        }
        else if ((options->super_HighsOptionsStruct).log_dev_level != 0) {
          log_options_ = &(options->super_HighsOptionsStruct).log_options;
          uVar12 = local_b8._0_8_;
          local_d8 = dVar20;
          dStack_d0 = dVar22;
          local_c8 = dVar22;
          dStack_c0 = dVar22;
          local_b8 = auVar24;
          local_98 = dVar27;
          uStack_90 = uVar28;
          local_88 = dVar25;
          uStack_80 = uVar26;
          highsLogDev(log_options_,kInfo,
                      "Scaling: Factors are in [%0.4g, %0.4g] for columns and in [%0.4g, %0.4g] for rows\n"
                      ,dVar19,dVar17,dVar21,uVar12);
          highsLogDev(log_options_,kInfo,
                      "Scaling: Yields [min, max, ratio] matrix values of [%0.4g, %0.4g, %0.4g]; Originally [%0.4g, %0.4g, %0.4g]: Improvement of %0.4g\n"
                      ,local_98,local_88,local_c8,local_78,local_68,local_b8._0_8_,local_d8);
          dVar20 = local_d8;
        }
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&row_max_value.super__Vector_base<double,_std::allocator<double>_>);
        return 1.0 < dVar20;
      }
      uVar13 = uVar15 + 1;
      iVar4 = piVar6[uVar15 + 1];
      piVar7 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar29 = 0.0;
      for (lVar14 = (long)piVar6[uVar15]; lVar14 < iVar4; lVar14 = lVar14 + 1) {
        dVar18 = pdVar9[piVar7[lVar14]] * pdVar8[lVar14];
        pdVar8[lVar14] = dVar18;
        dVar18 = ABS(dVar18);
        if (dVar18 <= dVar29) {
          dVar18 = dVar29;
        }
        dVar29 = dVar18;
      }
    } while ((dVar29 == 0.0) && (!NAN(dVar29)));
    local_98 = dVar27;
    uStack_90 = uVar28;
    local_88 = dVar25;
    uStack_80 = uVar26;
    local_58 = dVar17;
    local_50 = dVar19;
    dVar20 = log(1.0 / dVar29);
    dVar20 = floor(dVar20 / 0.6931471805599453 + 0.5);
    dVar20 = exp2(dVar20);
    if (dVar20 <= local_a0) {
      dVar20 = local_a0;
    }
    dVar21 = local_c8;
    if (dVar20 <= local_c8) {
      dVar21 = dVar20;
    }
    pdVar8 = (lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8[uVar15] = dVar21;
    piVar6 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = piVar6[uVar13];
    dVar25 = local_88;
    uVar26 = uStack_80;
    dVar27 = local_98;
    uVar28 = uStack_90;
    for (lVar14 = (long)piVar6[uVar15]; lVar14 < iVar4; lVar14 = lVar14 + 1) {
      dVar20 = pdVar8[uVar15] * pdVar9[lVar14];
      pdVar9[lVar14] = dVar20;
      dVar20 = ABS(dVar20);
      uVar26 = 0;
      uVar28 = 0;
      dVar22 = dVar20;
      if (dVar27 <= dVar20) {
        dVar22 = dVar27;
      }
      if (dVar20 <= dVar25) {
        dVar20 = dVar25;
      }
      dVar25 = dVar20;
      dVar27 = dVar22;
    }
    dVar19 = local_50;
    if (dVar21 <= local_50) {
      dVar19 = dVar21;
    }
    dVar17 = local_58;
    dVar20 = local_68;
    dVar22 = local_78;
    if (local_58 <= dVar21) {
      dVar17 = dVar21;
    }
  } while( true );
}

Assistant:

bool maxValueScaleMatrix(const HighsOptions& options, HighsLp& lp,
                         const HighsInt use_scale_strategy) {
  HighsInt numCol = lp.num_col_;
  HighsInt numRow = lp.num_row_;
  HighsScale& scale = lp.scale_;
  vector<double>& colScale = scale.col;
  vector<double>& rowScale = scale.row;
  vector<HighsInt>& Astart = lp.a_matrix_.start_;
  vector<HighsInt>& Aindex = lp.a_matrix_.index_;
  vector<double>& Avalue = lp.a_matrix_.value_;

  assert(options.simplex_scale_strategy == kSimplexScaleStrategyMaxValue015 ||
         options.simplex_scale_strategy == kSimplexScaleStrategyMaxValue0157);

  // The 015(7) values refer to bit settings in FICO's scaling options.
  // Specifically
  //
  // 0: Row scaling
  //
  // 1: Column scaling
  //
  // 5: Scale by maximum element
  //
  // 7: Scale objective function for the simplex method
  //
  // Note that 7 is not yet implemented, so
  // kSimplexScaleStrategyMaxValue015 and
  // kSimplexScaleStrategyMaxValue0157 are equivalent. However, cost
  // scaling could be well worth adding, now that the unscaled problem
  // can be solved using scaled NLA

  const double log2 = log(2.0);
  const double max_allow_scale = pow(2.0, options.allowed_matrix_scale_factor);
  const double min_allow_scale = 1 / max_allow_scale;

  const double min_allow_col_scale = min_allow_scale;
  const double max_allow_col_scale = max_allow_scale;
  const double min_allow_row_scale = min_allow_scale;
  const double max_allow_row_scale = max_allow_scale;

  double min_row_scale = kHighsInf;
  double max_row_scale = 0;
  double original_matrix_min_value = kHighsInf;
  double original_matrix_max_value = 0;
  // Determine the row scaling. Also determine the max/min row scaling
  // factors, and max/min original matrix values
  vector<double> row_max_value(numRow, 0);
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
      const HighsInt iRow = Aindex[k];
      const double value = fabs(Avalue[k]);
      row_max_value[iRow] = max(row_max_value[iRow], value);
      original_matrix_min_value = min(original_matrix_min_value, value);
      original_matrix_max_value = max(original_matrix_max_value, value);
    }
  }
  for (HighsInt iRow = 0; iRow < numRow; iRow++) {
    if (row_max_value[iRow]) {
      double row_scale_value = 1 / row_max_value[iRow];
      // Convert the row scale factor to the nearest power of two, and
      // ensure that it is not excessively large or small
      row_scale_value = pow(2.0, floor(log(row_scale_value) / log2 + 0.5));
      row_scale_value =
          min(max(min_allow_row_scale, row_scale_value), max_allow_row_scale);
      min_row_scale = min(row_scale_value, min_row_scale);
      max_row_scale = max(row_scale_value, max_row_scale);
      rowScale[iRow] = row_scale_value;
    }
  }
  // Determine the column scaling, whilst applying the row scaling
  // Also determine the max/min column scaling factors, and max/min
  // matrix values
  double min_col_scale = kHighsInf;
  double max_col_scale = 0;
  double matrix_min_value = kHighsInf;
  double matrix_max_value = 0;
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    double col_max_value = 0;
    for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
      const HighsInt iRow = Aindex[k];
      Avalue[k] *= rowScale[iRow];
      const double value = fabs(Avalue[k]);
      col_max_value = max(col_max_value, value);
    }
    if (col_max_value) {
      double col_scale_value = 1 / col_max_value;
      // Convert the col scale factor to the nearest power of two, and
      // ensure that it is not excessively large or small
      col_scale_value = pow(2.0, floor(log(col_scale_value) / log2 + 0.5));
      col_scale_value =
          min(max(min_allow_col_scale, col_scale_value), max_allow_col_scale);
      min_col_scale = min(col_scale_value, min_col_scale);
      max_col_scale = max(col_scale_value, max_col_scale);
      colScale[iCol] = col_scale_value;
      for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
        Avalue[k] *= colScale[iCol];
        const double value = fabs(Avalue[k]);
        matrix_min_value = min(matrix_min_value, value);
        matrix_max_value = max(matrix_max_value, value);
      }
    }
  }
  const double matrix_value_ratio = matrix_max_value / matrix_min_value;
  const double original_matrix_value_ratio =
      original_matrix_max_value / original_matrix_min_value;
  const double matrix_value_ratio_improvement =
      original_matrix_value_ratio / matrix_value_ratio;

  const double improvement_factor = matrix_value_ratio_improvement;

  const double improvement_factor_required = 1.0;
  const bool poor_improvement =
      improvement_factor <= improvement_factor_required;

  if (poor_improvement) {
    // Unscale the matrix
    for (HighsInt iCol = 0; iCol < numCol; iCol++) {
      for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
        HighsInt iRow = Aindex[k];
        Avalue[k] /= (colScale[iCol] * rowScale[iRow]);
      }
    }
    if (options.log_dev_level)
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Scaling: Improvement factor %0.4g < %0.4g required, so no "
                  "scaling applied\n",
                  improvement_factor, improvement_factor_required);
    return false;
  } else {
    if (options.log_dev_level) {
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Scaling: Factors are in [%0.4g, %0.4g] for columns and in "
                  "[%0.4g, %0.4g] for rows\n",
                  min_col_scale, max_col_scale, min_row_scale, max_row_scale);
      highsLogDev(
          options.log_options, HighsLogType::kInfo,
          "Scaling: Yields [min, max, ratio] matrix values of [%0.4g, %0.4g, "
          "%0.4g]; Originally [%0.4g, %0.4g, %0.4g]: Improvement of %0.4g\n",
          matrix_min_value, matrix_max_value, matrix_value_ratio,
          original_matrix_min_value, original_matrix_max_value,
          original_matrix_value_ratio, matrix_value_ratio_improvement);
    }
    return true;
  }
}